

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int ptls_buffer_push_asn1_ubigint(ptls_buffer_t *buf,void *bignum,size_t size)

{
  char *pcVar1;
  size_t sVar2;
  uint8_t *puVar3;
  int iVar4;
  long lVar5;
  size_t len;
  size_t sVar6;
  char *__s;
  st_ptls_key_schedule_t *sched;
  uint uVar7;
  char *pcVar8;
  ptls_buffer_t *buf_00;
  ushort in_R8W;
  size_t sVar9;
  size_t sVar10;
  ulong uVar11;
  timeval tStack_68;
  ptls_buffer_t *ppStack_58;
  char *pcStack_50;
  size_t sStack_48;
  ulong uStack_40;
  char *pcStack_38;
  
  pcVar1 = (char *)((long)bignum + size);
  if (0 < (long)size) {
    for (; *bignum == '\0'; bignum = (void *)((long)bignum + 1)) {
      size = size - 1;
      if ((long)size < 1) {
        size = 0;
        bignum = pcVar1;
        break;
      }
    }
  }
  iVar4 = ptls_buffer_reserve(buf,1);
  if (iVar4 == 0) {
    buf->base[buf->off] = '\x02';
    buf->off = buf->off + 1;
    iVar4 = ptls_buffer_reserve(buf,1);
    if (iVar4 == 0) {
      __s = (char *)buf->off;
      __s[(long)buf->base] = -1;
      sVar2 = buf->off;
      sVar9 = sVar2 + 1;
      buf->off = sVar9;
      if (*bignum < '\0') {
        iVar4 = ptls_buffer_reserve(buf,1);
        if (iVar4 != 0) {
          return iVar4;
        }
        __s = (char *)buf->off;
        __s[(long)buf->base] = '\0';
        buf->off = buf->off + 1;
      }
      if ((char *)bignum == pcVar1) {
        size = 1;
        uVar7 = 1;
        buf_00 = buf;
        iVar4 = ptls_buffer_reserve(buf,1);
        if (iVar4 != 0) {
          return iVar4;
        }
        __s = (char *)buf->off;
        __s[(long)buf->base] = '\0';
      }
      else {
        iVar4 = ptls_buffer_reserve(buf,size);
        if (iVar4 != 0) {
          return iVar4;
        }
        buf_00 = (ptls_buffer_t *)(buf->base + buf->off);
        pcVar8 = (char *)bignum;
        memcpy(buf_00,bignum,size);
        uVar7 = (uint)pcVar8;
      }
      sVar10 = size + buf->off;
      buf->off = sVar10;
      uVar11 = sVar10 - sVar9;
      if (0x7f < uVar11) {
        ptls_buffer_push_asn1_ubigint_cold_1();
        ppStack_58 = buf;
        pcStack_50 = pcVar1;
        sStack_48 = sVar9;
        uStack_40 = uVar11;
        pcStack_38 = (char *)bignum;
        iVar4 = ptls_buffer_reserve(buf_00,2);
        if (iVar4 == 0) {
          puVar3 = buf_00->base;
          sVar2 = buf_00->off;
          (puVar3 + sVar2)[0] = '\0';
          (puVar3 + sVar2)[1] = '\0';
          sVar2 = buf_00->off;
          buf_00->off = sVar2 + 2;
          gettimeofday(&tStack_68,(__timezone_ptr_t)0x0);
          iVar4 = ptls_buffer_reserve(buf_00,8);
          if (iVar4 == 0) {
            uVar11 = tStack_68.tv_sec * 1000 + tStack_68.tv_usec / 1000;
            *(ulong *)(buf_00->base + buf_00->off) =
                 uVar11 >> 0x38 | (uVar11 & 0xff000000000000) >> 0x28 |
                 (uVar11 & 0xff0000000000) >> 0x18 | (uVar11 & 0xff00000000) >> 8 |
                 (uVar11 & 0xff000000) << 8 | (uVar11 & 0xff0000) << 0x18 |
                 (uVar11 & 0xff00) << 0x28 | uVar11 << 0x38;
            buf_00->off = buf_00->off + 8;
            iVar4 = ptls_buffer_reserve(buf_00,2);
            if (iVar4 == 0) {
              puVar3 = buf_00->base;
              sVar9 = buf_00->off;
              (puVar3 + sVar9)[0] = '\0';
              (puVar3 + sVar9)[1] = '\0';
              sVar9 = buf_00->off;
              buf_00->off = sVar9 + 2;
              iVar4 = ptls_buffer_reserve(buf_00,sched->algo->digest_size);
              if ((iVar4 == 0) &&
                 (iVar4 = derive_secret(sched,buf_00->base + buf_00->off,"resumption master secret")
                 , iVar4 == 0)) {
                sVar10 = buf_00->off + sched->algo->digest_size;
                buf_00->off = sVar10;
                lVar5 = sVar10 - (sVar9 + 2);
                buf_00->base[sVar9] = (uint8_t)((ulong)lVar5 >> 8);
                buf_00->base[sVar9 + 1] = (uint8_t)lVar5;
                iVar4 = ptls_buffer_reserve(buf_00,2);
                if (iVar4 == 0) {
                  *(ushort *)(buf_00->base + buf_00->off) = in_R8W << 8 | in_R8W >> 8;
                  buf_00->off = buf_00->off + 2;
                  iVar4 = ptls_buffer_reserve(buf_00,4);
                  if (iVar4 == 0) {
                    *(uint *)(buf_00->base + buf_00->off) =
                         uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 |
                         uVar7 << 0x18;
                    buf_00->off = buf_00->off + 4;
                    iVar4 = ptls_buffer_reserve(buf_00,2);
                    if (iVar4 == 0) {
                      puVar3 = buf_00->base;
                      sVar9 = buf_00->off;
                      (puVar3 + sVar9)[0] = '\0';
                      (puVar3 + sVar9)[1] = '\0';
                      sVar10 = buf_00->off;
                      sVar9 = sVar10 + 2;
                      buf_00->off = sVar9;
                      sVar6 = sVar9;
                      if (__s != (char *)0x0) {
                        len = strlen(__s);
                        iVar4 = ptls_buffer__do_pushv(buf_00,__s,len);
                        if (iVar4 != 0) {
                          return iVar4;
                        }
                        sVar6 = buf_00->off;
                      }
                      buf_00->base[sVar10] = (uint8_t)(sVar6 - sVar9 >> 8);
                      buf_00->base[sVar10 + 1] = (uint8_t)(sVar6 - sVar9);
                      lVar5 = buf_00->off - (sVar2 + 2);
                      buf_00->base[sVar2] = (uint8_t)((ulong)lVar5 >> 8);
                      buf_00->base[sVar2 + 1] = (uint8_t)lVar5;
                      iVar4 = 0;
                    }
                  }
                }
              }
            }
          }
        }
        return iVar4;
      }
      buf->base[sVar2] = (uint8_t)uVar11;
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

int ptls_buffer_push_asn1_ubigint(ptls_buffer_t *buf, const void *bignum, size_t size)
{
    const uint8_t *p = bignum, *end = p + size;
    int ret;

    /* skip zeroes */
    for (; end - p >= 1; ++p)
        if (*p != 0)
            break;

    /* emit */
    ptls_buffer_push(buf, 2);
    ptls_buffer_push_asn1_block(buf, {
        if (*p >= 0x80)
            ptls_buffer_push(buf, 0);
        if (p != end) {
            ptls_buffer_pushv(buf, p, end - p);
        } else {
            ptls_buffer_pushv(buf, "", 1);
        }
    });
    ret = 0;

Exit:
    return ret;
}